

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::
write_int<unsigned_long,fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
          (BasicWriter<char> *this,unsigned_long value,
          IntFormatSpec<unsigned_long,_fmt::TypeSpec<__x00_>,_char> spec)

{
  ThousandsSep thousands_sep;
  StringRef sep_00;
  bool bVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  CharPtr pcVar5;
  lconv *plVar6;
  char *pcVar7;
  ulong in_RSI;
  CharPtr p_4;
  uint size;
  StringRef sep;
  uint num_digits_4;
  char *p_3;
  uint num_digits_3;
  UnsignedType n_2;
  char *p_2;
  uint num_digits_2;
  UnsignedType n_1;
  char *digits;
  char *p_1;
  uint num_digits_1;
  UnsignedType n;
  CharPtr p;
  uint num_digits;
  char prefix [4];
  UnsignedType abs_value;
  uint prefix_size;
  char *in_stack_fffffffffffffeb8;
  BasicStringRef<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffed0;
  char *local_100;
  char local_f1;
  uint in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  IntFormatSpec<unsigned_long,_fmt::TypeSpec<__x00_>,_char> *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff34;
  BasicWriter<char> *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  LConvCheck<char_*lconv::*,_&lconv::thousands_sep> local_b1;
  StringRef local_b0;
  BasicStringRef<char> local_a0;
  uint local_8c;
  char *local_88;
  int local_7c;
  ulong local_78;
  char *local_70;
  int local_64;
  ulong local_60;
  char *local_50;
  int local_44;
  ulong local_40;
  char *local_38;
  uint local_30;
  char local_2c [4];
  ulong local_28;
  uint local_1c;
  TypeSpec<__x00_> local_8 [8];
  
  cVar3 = (char)((ulong)in_stack_ffffffffffffff40 >> 0x38);
  local_1c = 0;
  local_28 = in_RSI;
  memset(local_2c,0,4);
  bVar1 = internal::is_negative<unsigned_long>(0x1e9e28);
  if (bVar1) {
    local_2c[0] = '-';
    local_1c = local_1c + 1;
    local_28 = -local_28;
  }
  else {
    bVar1 = TypeSpec<'\x00'>::flag(local_8,1);
    if (bVar1) {
      bVar1 = TypeSpec<'\x00'>::flag(local_8,2);
      local_f1 = '+';
      if (!bVar1) {
        local_f1 = ' ';
      }
      local_2c[0] = local_f1;
      local_1c = local_1c + 1;
    }
  }
  cVar2 = TypeSpec<'\x00'>::type(local_8);
  if (cVar2 == '\0') {
LAB_001e9f3c:
    local_30 = internal::count_digits((uint64_t)in_stack_fffffffffffffec0);
    pcVar5 = prepare_int_buffer<fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff1c);
    local_38 = pcVar5 + 1;
    get(local_38);
    internal::format_decimal<unsigned_long,char>
              ((char *)in_stack_fffffffffffffec0,(unsigned_long)in_stack_fffffffffffffeb8,0);
    return;
  }
  if (cVar2 == 'B') {
LAB_001ea125:
    local_60 = local_28;
    bVar1 = TypeSpec<'\x00'>::flag(local_8,8);
    if (bVar1) {
      uVar4 = (ulong)local_1c;
      local_1c = local_1c + 1;
      local_2c[uVar4] = '0';
      cVar3 = TypeSpec<'\x00'>::type(local_8);
      uVar4 = (ulong)local_1c;
      local_1c = local_1c + 1;
      local_2c[uVar4] = cVar3;
    }
    local_64 = 0;
    do {
      local_64 = local_64 + 1;
      local_60 = local_60 >> 1;
    } while (local_60 != 0);
    pcVar5 = prepare_int_buffer<fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff1c);
    local_70 = get(pcVar5);
    local_60 = local_28;
    do {
      *local_70 = ((byte)local_60 & 1) + 0x30;
      local_60 = local_60 >> 1;
      local_70 = local_70 + -1;
    } while (local_60 != 0);
  }
  else {
    if (cVar2 != 'X') {
      if (cVar2 == 'b') goto LAB_001ea125;
      if (cVar2 == 'd') goto LAB_001e9f3c;
      if (cVar2 == 'n') {
        local_8c = internal::count_digits((uint64_t)in_stack_fffffffffffffec0);
        BasicStringRef<char>::BasicStringRef(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        plVar6 = localeconv();
        internal::LConvCheck<char_*lconv::*,_&lconv::thousands_sep>::LConvCheck(&local_b1,0);
        local_b0 = internal::thousands_sep<lconv>(plVar6);
        local_a0.data_ = local_b0.data_;
        local_a0.size_ = local_b0.size_;
        uVar4 = (ulong)local_8c;
        BasicStringRef<char>::size(&local_a0);
        pcVar5 = prepare_int_buffer<fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
                           (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                            in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff1c);
        pcVar7 = get(pcVar5 + 1);
        sep_00.size_ = local_a0.size_;
        sep_00.data_ = local_a0.data_;
        internal::ThousandsSep::ThousandsSep((ThousandsSep *)&stack0xffffffffffffff28,sep_00);
        thousands_sep.sep_.size_ = uVar4;
        thousands_sep.sep_.data_ = (char *)plVar6;
        thousands_sep._16_8_ = pcVar7;
        internal::format_decimal<unsigned_long,char,fmt::internal::ThousandsSep>
                  (in_stack_fffffffffffffed0,(unsigned_long)in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff34,thousands_sep);
        return;
      }
      if (cVar2 == 'o') {
        local_78 = local_28;
        bVar1 = TypeSpec<'\x00'>::flag(local_8,8);
        if (bVar1) {
          uVar4 = (ulong)local_1c;
          local_1c = local_1c + 1;
          local_2c[uVar4] = '0';
        }
        local_7c = 0;
        do {
          local_7c = local_7c + 1;
          local_78 = local_78 >> 3;
        } while (local_78 != 0);
        pcVar5 = prepare_int_buffer<fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
                           (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                            in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff1c);
        local_88 = get(pcVar5);
        local_78 = local_28;
        do {
          *local_88 = ((byte)local_78 & 7) + 0x30;
          local_78 = local_78 >> 3;
          local_88 = local_88 + -1;
        } while (local_78 != 0);
        return;
      }
      if (cVar2 != 'x') {
        TypeSpec<'\x00'>::type(local_8);
        TypeSpec<'\x00'>::flag(local_8,0x10);
        internal::report_unknown_type(cVar3,(char *)in_stack_ffffffffffffff38);
        return;
      }
    }
    local_40 = local_28;
    bVar1 = TypeSpec<'\x00'>::flag(local_8,8);
    if (bVar1) {
      uVar4 = (ulong)local_1c;
      local_1c = local_1c + 1;
      local_2c[uVar4] = '0';
      cVar3 = TypeSpec<'\x00'>::type(local_8);
      uVar4 = (ulong)local_1c;
      local_1c = local_1c + 1;
      local_2c[uVar4] = cVar3;
    }
    local_44 = 0;
    do {
      local_44 = local_44 + 1;
      local_40 = local_40 >> 4;
    } while (local_40 != 0);
    pcVar5 = prepare_int_buffer<fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff1c);
    local_50 = get(pcVar5);
    local_40 = local_28;
    cVar3 = TypeSpec<'\x00'>::type(local_8);
    if (cVar3 == 'x') {
      local_100 = "0123456789abcdef";
    }
    else {
      local_100 = "0123456789ABCDEF";
    }
    do {
      *local_50 = local_100[local_40 & 0xf];
      local_40 = local_40 >> 4;
      local_50 = local_50 + -1;
    } while (local_40 != 0);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}